

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestreamin_file.hpp
# Opt level: O2

BOOL __thiscall ByteStreamInFile::seekEnd(ByteStreamInFile *this,I64 distance)

{
  int iVar1;
  
  iVar1 = fseeko((FILE *)this->file,-distance,2);
  return iVar1 == 0;
}

Assistant:

inline BOOL ByteStreamInFile::seekEnd(const I64 distance)
{
#if defined _WIN32 && ! defined (__MINGW32__)
  return !(_fseeki64(file, -distance, SEEK_END));
#elif defined (__MINGW32__)
  return !(fseeko64(file, (off64_t)-distance, SEEK_END));
#else
  return !(fseeko(file, (off_t)-distance, SEEK_END));
#endif
}